

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O0

void __thiscall Js::ScopeInfo::ExtractScopeInfo(ScopeInfo *this,Parser *parser,Scope *scope)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  charcount_t len;
  uint uVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  PropertyRecord *name_00;
  char16 *string;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc_00;
  Symbol *pSVar5;
  CharacterBuffer<char16_t> *this_02;
  char16_t *pcVar6;
  TrackAllocData local_98;
  Symbol *local_70;
  Symbol *sym;
  SymbolName symName;
  SymbolType symbolType;
  PropertyRecord *pPStack_50;
  PropertyId propertyId_1;
  PropertyRecord *name_1;
  int i_1;
  PropertyRecord *name;
  PropertyId propertyId;
  int i;
  ArenaAllocator *alloc;
  ScriptContext *scriptContext;
  Scope *scope_local;
  Parser *parser_local;
  ScopeInfo *this_local;
  
  Scope::SetMustInstantiate(scope,(*(ushort *)&this->field_0x10 >> 2 & 1) != 0);
  Scope::SetHasOwnLocalInClosure(scope,(*(ushort *)&this->field_0x10 >> 5 & 1) != 0);
  Scope::SetIsDynamic(scope,(*(ushort *)&this->field_0x10 & 1) != 0);
  if ((*(ushort *)&this->field_0x10 >> 1 & 1) != 0) {
    Scope::SetIsObject(scope);
  }
  if (parser == (Parser *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0xed,"(parser)","parser");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = Parser::GetScriptContext(parser);
  this_01 = &Parser::GetAllocator(parser)->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  if (((*(ushort *)&this->field_0x10 >> 4 & 1) == 0) &&
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,CacheScopeInfoNamesPhase), !bVar2)) {
    for (name._4_4_ = 0; name._4_4_ < this->symbolCount; name._4_4_ = name._4_4_ + 1) {
      propertyId_00 = GetSymbolId(this,name._4_4_);
      if (propertyId_00 != 0) {
        name_00 = ScriptContext::GetPropertyName(this_00,propertyId_00);
        SetPropertyName(this,name._4_4_,name_00);
      }
    }
    *(ushort *)&this->field_0x10 = *(ushort *)&this->field_0x10 & 0xffef | 0x10;
  }
  name_1._4_4_ = 0;
  do {
    if (this->symbolCount <= name_1._4_4_) {
      this->scope = scope;
      *(ushort *)&scope->field_0x44 = *(ushort *)&scope->field_0x44 & 0xf7ff | 0x800;
      return;
    }
    pPStack_50 = (PropertyRecord *)0x0;
    if ((*(ushort *)&this->field_0x10 >> 4 & 1) == 0) {
      symName._12_4_ = GetSymbolId(this,name_1._4_4_);
      if (symName._12_4_ != 0) {
        pPStack_50 = ScriptContext::GetPropertyName(this_00,symName._12_4_);
      }
    }
    else {
      pPStack_50 = GetPropertyName(this,name_1._4_4_);
    }
    if (pPStack_50 != (PropertyRecord *)0x0) {
      symName.len._3_1_ = GetSymbolType(this,name_1._4_4_);
      string = PropertyRecord::GetBuffer(pPStack_50);
      len = PropertyRecord::GetLength(pPStack_50);
      JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                ((CharacterBuffer<char16_t> *)&sym,string,len);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_98,(type_info *)&Symbol::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                 ,0x117);
      alloc_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(this_01,&local_98);
      pSVar5 = (Symbol *)new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)alloc_00,0x3f67b0);
      Symbol::Symbol(pSVar5,(SymbolName *)&sym,(ParseNode *)0x0,symName.len._3_1_);
      local_70 = pSVar5;
      Symbol::SetScopeSlot(pSVar5,name_1._4_4_);
      pSVar5 = local_70;
      bVar2 = GetIsBlockVariable(this,name_1._4_4_);
      Symbol::SetIsBlockVar(pSVar5,bVar2);
      pSVar5 = local_70;
      bVar2 = GetIsConst(this,name_1._4_4_);
      Symbol::SetIsConst(pSVar5,bVar2);
      pSVar5 = local_70;
      bVar2 = GetIsFuncExpr(this,name_1._4_4_);
      Symbol::SetIsFuncExpr(pSVar5,bVar2);
      pSVar5 = local_70;
      bVar2 = GetIsModuleExportStorage(this,name_1._4_4_);
      Symbol::SetIsModuleExportStorage(pSVar5,bVar2);
      pSVar5 = local_70;
      bVar2 = GetIsModuleImport(this,name_1._4_4_);
      Symbol::SetIsModuleImport(pSVar5,bVar2);
      pSVar5 = local_70;
      bVar2 = GetNeedDeclaration(this,name_1._4_4_);
      Symbol::SetNeedDeclaration(pSVar5,bVar2);
      bVar2 = GetHasFuncAssignment(this,name_1._4_4_);
      if (bVar2) {
        Symbol::RestoreHasFuncAssignment(local_70);
      }
      Scope::AddNewSymbol(scope,local_70);
      Symbol::SetHasNonLocalReference(local_70);
      if (parser == (Parser *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                    ,0x126,"(parser)","parser");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      Parser::RestorePidRefForSym(parser,local_70);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
      if (bVar2) {
        this_02 = Symbol::GetName(local_70);
        pcVar6 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_02);
        uVar3 = Symbol::GetScopeSlot(local_70);
        Output::Print(L"%12s %d\n",pcVar6,(ulong)uVar3);
      }
    }
    name_1._4_4_ = name_1._4_4_ + 1;
  } while( true );
}

Assistant:

void ScopeInfo::ExtractScopeInfo(Parser *parser, /*ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo,*/ Scope* scope)
    {
        ScriptContext* scriptContext;
        ArenaAllocator* alloc;

        // Load scope attributes and push onto scope stack.
        scope->SetMustInstantiate(this->mustInstantiate);
        scope->SetHasOwnLocalInClosure(this->hasLocalInClosure);
        scope->SetIsDynamic(this->isDynamic);
        if (this->isObject)
        {
            scope->SetIsObject();
        }

        Assert(parser);

        scriptContext = parser->GetScriptContext();
        alloc = parser->GetAllocator();

        // Load scope symbols
        // On first access to the scopeinfo, replace the ID's with PropertyRecord*'s to save the dictionary lookup
        // on later accesses. Replace them all before allocating Symbol's to prevent inconsistency on OOM.
        if (!this->areNamesCached && !PHASE_OFF1(Js::CacheScopeInfoNamesPhase))
        {
            for (int i = 0; i < symbolCount; i++)
            {
                PropertyId propertyId = GetSymbolId(i);
                if (propertyId != 0) // There may be empty slots, e.g. "arguments" may have no slot
                {
                    PropertyRecord const* name = scriptContext->GetPropertyName(propertyId);
                    this->SetPropertyName(i, name);
                }
            }
            this->areNamesCached = true;
        }

        for (int i = 0; i < symbolCount; i++)
        {
            PropertyRecord const* name = nullptr;
            if (this->areNamesCached)
            {
                name = this->GetPropertyName(i);
            }
            else
            {
                PropertyId propertyId = GetSymbolId(i);
                if (propertyId != 0) // There may be empty slots, e.g. "arguments" may have no slot
                {
                    name = scriptContext->GetPropertyName(propertyId);
                }
            }

            if (name != nullptr)
            {
                SymbolType symbolType = GetSymbolType(i);
                SymbolName symName(name->GetBuffer(), name->GetLength());
                Symbol *sym = Anew(alloc, Symbol, symName, nullptr, symbolType);

                sym->SetScopeSlot(static_cast<PropertyId>(i));
                sym->SetIsBlockVar(GetIsBlockVariable(i));
                sym->SetIsConst(GetIsConst(i));
                sym->SetIsFuncExpr(GetIsFuncExpr(i));
                sym->SetIsModuleExportStorage(GetIsModuleExportStorage(i));
                sym->SetIsModuleImport(GetIsModuleImport(i));
                sym->SetNeedDeclaration(GetNeedDeclaration(i));
                if (GetHasFuncAssignment(i))
                {
                    sym->RestoreHasFuncAssignment();
                }
                scope->AddNewSymbol(sym);
                sym->SetHasNonLocalReference();
                Assert(parser);
                parser->RestorePidRefForSym(sym);

                TRACE_BYTECODE(_u("%12s %d\n"), sym->GetName().GetBuffer(), sym->GetScopeSlot());
            }
        }
        this->scope = scope;
        DebugOnly(scope->isRestored = true);
    }